

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O1

void __thiscall TGAImage::clear(TGAImage *this)

{
  allocator_type local_2a;
  value_type_conflict2 local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_29 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_28,(ulong)(this->height * this->width * this->bytespp),&local_29,&local_2a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&this->data,&local_28);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TGAImage::clear() { data = std::vector<std::uint8_t>(width * height * bytespp, 0); }